

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

ps_config_t * ps_config_init(ps_arg_t *defn)

{
  ps_config_t *ppVar1;
  hash_table_t *phVar2;
  cmd_ln_val_t *val_00;
  cmd_ln_val_t *val;
  int ndef;
  int i;
  ps_config_t *config;
  ps_arg_t *defn_local;
  
  ppVar1 = (ps_config_t *)
           __ckd_calloc__(1,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                          ,0x37);
  ppVar1->refcount = 1;
  if (defn == (ps_arg_t *)0x0) {
    ppVar1->defn = ps_args_def;
  }
  else {
    ppVar1->defn = defn;
  }
  val._0_4_ = 0;
  while (ppVar1->defn[(int)val].name != (char *)0x0) {
    val._0_4_ = (int)val + 1;
  }
  phVar2 = hash_table_new((int)val,0);
  ppVar1->ht = phVar2;
  for (val._4_4_ = 0; val._4_4_ < (int)val; val._4_4_ = val._4_4_ + 1) {
    val_00 = cmd_ln_val_init(ppVar1->defn[val._4_4_].type,ppVar1->defn[val._4_4_].name,
                             ppVar1->defn[val._4_4_].deflt);
    if (val_00 == (cmd_ln_val_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
              ,0x49,"Bad default argument value for %s: %s\n",ppVar1->defn[val._4_4_].name,
              ppVar1->defn[val._4_4_].deflt);
    }
    else {
      hash_table_enter(ppVar1->ht,val_00->name,val_00);
    }
  }
  return ppVar1;
}

Assistant:

ps_config_t *
ps_config_init(const ps_arg_t *defn)
{
    ps_config_t *config = ckd_calloc(1, sizeof(*config));
    int i, ndef;
    
    config->refcount = 1;
    if (defn)
        config->defn = defn;
    else
        config->defn = ps_args_def;
    for (ndef = 0; config->defn[ndef].name; ndef++)
        ;
    config->ht = hash_table_new(ndef, FALSE);
    for (i = 0; i < ndef; i++) {
        cmd_ln_val_t *val;
        if ((val = cmd_ln_val_init(config->defn[i].type,
                                   config->defn[i].name,
                                   config->defn[i].deflt)) == NULL) {
            E_ERROR
                ("Bad default argument value for %s: %s\n",
                 config->defn[i].name, config->defn[i].deflt);
            continue;
        }
        hash_table_enter(config->ht, val->name, (void *)val);
    }
    return config;
}